

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O2

void __thiscall App::setup(App *this)

{
  int iVar1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"data/spritesheet.json",&local_39);
  piksel::Spritesheet::load(&this->spritesheet,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  Character::setup(&this->character,&this->spritesheet,(this->super_BaseApp).height);
  initBricks(this);
  iVar1 = piksel::BaseApp::millis(&this->super_BaseApp);
  piksel::Timer::reset(&this->enemySpawnTimer,iVar1);
  iVar1 = piksel::BaseApp::millis(&this->super_BaseApp);
  Ball::setup(&this->ball,iVar1);
  return;
}

Assistant:

void App::setup() {
    spritesheet.load("data/spritesheet.json");
    character.setup(spritesheet, height);
    initBricks();
    enemySpawnTimer.reset(millis());
    ball.setup(millis());
}